

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Model::clear_Type(Model *this)

{
  uint32 uVar1;
  
  uVar1 = this->_oneof_case_[0];
  if ((int)uVar1 < 600) {
    if ((int)uVar1 < 400) {
      if (299 < (int)uVar1) {
        switch(uVar1) {
        case 300:
        case 0x12d:
        case 0x12e:
        case 0x12f:
        case 0x130:
          goto switchD_00460f34_caseD_190;
        default:
          goto switchD_00460f34_default;
        }
      }
      if (((uVar1 != 200) && (uVar1 != 0xc9)) && (uVar1 != 0xca)) goto switchD_00460f34_default;
    }
    else {
      if ((int)uVar1 < 500) {
        switch(uVar1) {
        case 400:
        case 0x191:
        case 0x192:
        case 0x193:
        case 0x194:
          goto switchD_00460f34_caseD_190;
        default:
          goto switchD_00460f34_default;
        }
      }
      if ((int)uVar1 < 0x22b) {
        if ((uVar1 != 500) && (uVar1 != 0x1f5)) goto switchD_00460f34_default;
      }
      else if ((uVar1 != 0x22b) && (uVar1 != 0x22c)) goto switchD_00460f34_default;
    }
  }
  else {
    if ((int)uVar1 < 900) {
      switch(uVar1) {
      case 600:
      case 0x259:
      case 0x25a:
      case 0x25b:
      case 0x25c:
      case 0x25e:
      case 0x25f:
      case 0x261:
      case 0x262:
        goto switchD_00460f34_caseD_190;
      default:
        goto switchD_00460f34_default;
      }
    }
    switch(uVar1) {
    case 2000:
    case 0x7d1:
    case 0x7d2:
    case 0x7d3:
    case 0x7d4:
    case 0x7d5:
      break;
    default:
      if ((uVar1 != 900) && (uVar1 != 3000)) goto switchD_00460f34_default;
    }
  }
switchD_00460f34_caseD_190:
  if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
    (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
  }
switchD_00460f34_default:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Model::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Model)
  switch (Type_case()) {
    case kPipelineClassifier: {
      delete Type_.pipelineclassifier_;
      break;
    }
    case kPipelineRegressor: {
      delete Type_.pipelineregressor_;
      break;
    }
    case kPipeline: {
      delete Type_.pipeline_;
      break;
    }
    case kGlmRegressor: {
      delete Type_.glmregressor_;
      break;
    }
    case kSupportVectorRegressor: {
      delete Type_.supportvectorregressor_;
      break;
    }
    case kTreeEnsembleRegressor: {
      delete Type_.treeensembleregressor_;
      break;
    }
    case kNeuralNetworkRegressor: {
      delete Type_.neuralnetworkregressor_;
      break;
    }
    case kBayesianProbitRegressor: {
      delete Type_.bayesianprobitregressor_;
      break;
    }
    case kGlmClassifier: {
      delete Type_.glmclassifier_;
      break;
    }
    case kSupportVectorClassifier: {
      delete Type_.supportvectorclassifier_;
      break;
    }
    case kTreeEnsembleClassifier: {
      delete Type_.treeensembleclassifier_;
      break;
    }
    case kNeuralNetworkClassifier: {
      delete Type_.neuralnetworkclassifier_;
      break;
    }
    case kKNearestNeighborsClassifier: {
      delete Type_.knearestneighborsclassifier_;
      break;
    }
    case kNeuralNetwork: {
      delete Type_.neuralnetwork_;
      break;
    }
    case kItemSimilarityRecommender: {
      delete Type_.itemsimilarityrecommender_;
      break;
    }
    case kCustomModel: {
      delete Type_.custommodel_;
      break;
    }
    case kLinkedModel: {
      delete Type_.linkedmodel_;
      break;
    }
    case kOneHotEncoder: {
      delete Type_.onehotencoder_;
      break;
    }
    case kImputer: {
      delete Type_.imputer_;
      break;
    }
    case kFeatureVectorizer: {
      delete Type_.featurevectorizer_;
      break;
    }
    case kDictVectorizer: {
      delete Type_.dictvectorizer_;
      break;
    }
    case kScaler: {
      delete Type_.scaler_;
      break;
    }
    case kCategoricalMapping: {
      delete Type_.categoricalmapping_;
      break;
    }
    case kNormalizer: {
      delete Type_.normalizer_;
      break;
    }
    case kArrayFeatureExtractor: {
      delete Type_.arrayfeatureextractor_;
      break;
    }
    case kNonMaximumSuppression: {
      delete Type_.nonmaximumsuppression_;
      break;
    }
    case kIdentity: {
      delete Type_.identity_;
      break;
    }
    case kTextClassifier: {
      delete Type_.textclassifier_;
      break;
    }
    case kWordTagger: {
      delete Type_.wordtagger_;
      break;
    }
    case kVisionFeaturePrint: {
      delete Type_.visionfeatureprint_;
      break;
    }
    case kSoundAnalysisPreprocessing: {
      delete Type_.soundanalysispreprocessing_;
      break;
    }
    case kGazetteer: {
      delete Type_.gazetteer_;
      break;
    }
    case kWordEmbedding: {
      delete Type_.wordembedding_;
      break;
    }
    case kSerializedModel: {
      delete Type_.serializedmodel_;
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}